

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O2

int Prs_ManReadName(Prs_Man_t *p)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pStr;
  
  pStr = (byte *)p->pCur;
  bVar1 = *pStr;
  if (bVar1 == 0x5c) {
    pStr = pStr + 1;
    pbVar3 = pStr;
    do {
      p->pCur = (char *)pbVar3;
      bVar1 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar1 != 0x20);
  }
  else {
    if ((bVar1 != 0x5f) && ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) {
      return 0;
    }
    pbVar3 = pStr + 1;
    do {
      do {
        p->pCur = (char *)pbVar3;
        bVar1 = *pbVar3;
        pbVar3 = pbVar3 + 1;
      } while (0xf5 < (byte)(bVar1 - 0x3a));
    } while (((bVar1 == 0x24) || (bVar1 == 0x5f)) || (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)));
  }
  iVar2 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pStr,(char *)(pbVar3 + -1),(int *)0x0);
  return iVar2;
}

Assistant:

static inline int Prs_ManReadName( Prs_Man_t * p )
{
    char * pStart;
    Prs_ManSkipSpaces( p );
    if ( Prs_ManIsChar(p, '\n') )
        return 0;
    pStart = p->pCur;
    while ( !Prs_ManIsSpace(p) && !Prs_ManIsStop(p) )
        Prs_ManSkip(p);
    if ( pStart == p->pCur )
        return 0;
    return Abc_NamStrFindOrAddLim( p->pStrs, pStart, p->pCur, NULL );
}